

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O1

double __thiscall MotionTrajectory::CalculateNextTime(MotionTrajectory *this,int *curDir)

{
  int *piVar1;
  double dVar2;
  MotionBase *pMVar3;
  size_t sVar4;
  ulong uVar5;
  ostream *poVar6;
  long *plVar7;
  pointer ppMVar8;
  double extraout_XMM0_Qa;
  double dVar9;
  double extraout_XMM0_Qa_00;
  
  pMVar3 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
           _M_impl.super__Vector_impl_data._M_start[this->curIndex];
  piVar1 = &this->pos;
  (*pMVar3->_vptr_MotionBase[2])(this->tCur,pMVar3,piVar1,curDir);
  dVar9 = extraout_XMM0_Qa;
  if (extraout_XMM0_Qa < 0.0) {
    uVar5 = this->curIndex;
    ppMVar8 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (uVar5 < ((long)(this->motionList).
                       super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)ppMVar8 >> 3) - 1U) {
      do {
        dVar9 = ppMVar8[uVar5]->tf;
        dVar2 = ppMVar8[uVar5]->pf;
        if (this->tCur <= dVar9 && dVar9 != this->tCur) {
          this->tCur = dVar9;
        }
        dVar9 = 0.999999999;
        if (*curDir != -1) {
          dVar9 = 0.0;
        }
        if (*piVar1 != (int)(dVar9 + dVar2)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"CalculateNextTime: pos = ",0x19);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", pf = ",7);
          poVar6 = std::ostream::_M_insert<double>(dVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", dir = ",8);
          plVar7 = (long *)std::ostream::operator<<((ostream *)poVar6,*curDir);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
        }
        ppMVar8 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        sVar4 = this->curIndex;
        this->curIndex = sVar4 + 1;
        pMVar3 = ppMVar8[sVar4 + 1];
        (*pMVar3->_vptr_MotionBase[2])(this->tCur,pMVar3,piVar1,curDir);
        dVar9 = extraout_XMM0_Qa_00;
        if (0.0 <= extraout_XMM0_Qa_00) break;
        uVar5 = this->curIndex;
        ppMVar8 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar5 < ((long)(this->motionList).
                              super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppMVar8 >> 3) - 1U);
    }
  }
  if (0.0 <= dVar9) {
    this->tCur = dVar9;
  }
  return dVar9;
}

Assistant:

double MotionTrajectory::CalculateNextTime(int &curDir)
{
    double t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    while ((t < 0.0) && (curIndex < motionList.size()-1)) {
        double tf, pf, vf, af;
        motionList[curIndex]->GetFinalValues(tf, pf, vf, af);
        if (tCur < tf)
            tCur = tf;
        int endPos = static_cast<int>(pf + ((curDir == -1) ? (1-TINY) : 0));
        if (pos != endPos)
            std::cout << "CalculateNextTime: pos = " << pos << ", pf = " << pf << ", dir = " << curDir << std::endl;
        curIndex++;
        t = motionList[curIndex]->CalculateNextTime(tCur, pos, curDir);
    }
    if (t >= 0.0)
        tCur = t;
    return t;
}